

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PFNC.h
# Opt level: O0

char * GetPixelFormatName(PfncFormat format)

{
  PfncFormat format_local;
  char *local_8;
  
  if (format == InvalidPixelFormat) {
    local_8 = "InvalidPixelFormat";
  }
  else if (format == Mono1p) {
    local_8 = "Mono1p";
  }
  else if (format == Confidence1p) {
    local_8 = "Confidence1p";
  }
  else if (format == Mono2p) {
    local_8 = "Mono2p";
  }
  else if (format == Mono4p) {
    local_8 = "Mono4p";
  }
  else if (format == BayerGR4p) {
    local_8 = "BayerGR4p";
  }
  else if (format == BayerRG4p) {
    local_8 = "BayerRG4p";
  }
  else if (format == BayerGB4p) {
    local_8 = "BayerGB4p";
  }
  else if (format == BayerBG4p) {
    local_8 = "BayerBG4p";
  }
  else if (format == Mono8) {
    local_8 = "Mono8";
  }
  else if (format == Mono8s) {
    local_8 = "Mono8s";
  }
  else if (format == BayerGR8) {
    local_8 = "BayerGR8";
  }
  else if (format == BayerRG8) {
    local_8 = "BayerRG8";
  }
  else if (format == BayerGB8) {
    local_8 = "BayerGB8";
  }
  else if (format == BayerBG8) {
    local_8 = "BayerBG8";
  }
  else if (format == SCF1WBWG8) {
    local_8 = "SCF1WBWG8";
  }
  else if (format == SCF1WGWB8) {
    local_8 = "SCF1WGWB8";
  }
  else if (format == SCF1WGWR8) {
    local_8 = "SCF1WGWR8";
  }
  else if (format == SCF1WRWG8) {
    local_8 = "SCF1WRWG8";
  }
  else if (format == Coord3D_A8) {
    local_8 = "Coord3D_A8";
  }
  else if (format == Coord3D_B8) {
    local_8 = "Coord3D_B8";
  }
  else if (format == Coord3D_C8) {
    local_8 = "Coord3D_C8";
  }
  else if (format == Confidence1) {
    local_8 = "Confidence1";
  }
  else if (format == Confidence8) {
    local_8 = "Confidence8";
  }
  else if (format == R8) {
    local_8 = "R8";
  }
  else if (format == G8) {
    local_8 = "G8";
  }
  else if (format == B8) {
    local_8 = "B8";
  }
  else if (format == Data8) {
    local_8 = "Data8";
  }
  else if (format == Data8s) {
    local_8 = "Data8s";
  }
  else if (format == Mono10p) {
    local_8 = "Mono10p";
  }
  else if (format == BayerBG10p) {
    local_8 = "BayerBG10p";
  }
  else if (format == BayerGB10p) {
    local_8 = "BayerGB10p";
  }
  else if (format == BayerGR10p) {
    local_8 = "BayerGR10p";
  }
  else if (format == BayerRG10p) {
    local_8 = "BayerRG10p";
  }
  else if (format == SCF1WBWG10p) {
    local_8 = "SCF1WBWG10p";
  }
  else if (format == SCF1WGWB10p) {
    local_8 = "SCF1WGWB10p";
  }
  else if (format == SCF1WGWR10p) {
    local_8 = "SCF1WGWR10p";
  }
  else if (format == SCF1WRWG10p) {
    local_8 = "SCF1WRWG10p";
  }
  else if (format == R10_Deprecated) {
    local_8 = "R10_Deprecated";
  }
  else if (format == G10_Deprecated) {
    local_8 = "G10_Deprecated";
  }
  else if (format == B10_Deprecated) {
    local_8 = "B10_Deprecated";
  }
  else if (format == Coord3D_A10p) {
    local_8 = "Coord3D_A10p";
  }
  else if (format == Coord3D_B10p) {
    local_8 = "Coord3D_B10p";
  }
  else if (format == Coord3D_C10p) {
    local_8 = "Coord3D_C10p";
  }
  else if (format == Mono10Packed) {
    local_8 = "Mono10Packed";
  }
  else if (format == Mono12Packed) {
    local_8 = "Mono12Packed";
  }
  else if (format == BayerGR10Packed) {
    local_8 = "BayerGR10Packed";
  }
  else if (format == BayerRG10Packed) {
    local_8 = "BayerRG10Packed";
  }
  else if (format == BayerGB10Packed) {
    local_8 = "BayerGB10Packed";
  }
  else if (format == BayerBG10Packed) {
    local_8 = "BayerBG10Packed";
  }
  else if (format == BayerGR12Packed) {
    local_8 = "BayerGR12Packed";
  }
  else if (format == BayerRG12Packed) {
    local_8 = "BayerRG12Packed";
  }
  else if (format == BayerGB12Packed) {
    local_8 = "BayerGB12Packed";
  }
  else if (format == BayerBG12Packed) {
    local_8 = "BayerBG12Packed";
  }
  else if (format == Mono12p) {
    local_8 = "Mono12p";
  }
  else if (format == BayerBG12p) {
    local_8 = "BayerBG12p";
  }
  else if (format == BayerGB12p) {
    local_8 = "BayerGB12p";
  }
  else if (format == BayerGR12p) {
    local_8 = "BayerGR12p";
  }
  else if (format == BayerRG12p) {
    local_8 = "BayerRG12p";
  }
  else if (format == SCF1WBWG12p) {
    local_8 = "SCF1WBWG12p";
  }
  else if (format == SCF1WGWB12p) {
    local_8 = "SCF1WGWB12p";
  }
  else if (format == SCF1WGWR12p) {
    local_8 = "SCF1WGWR12p";
  }
  else if (format == SCF1WRWG12p) {
    local_8 = "SCF1WRWG12p";
  }
  else if (format == R12_Deprecated) {
    local_8 = "R12_Deprecated";
  }
  else if (format == G12_Deprecated) {
    local_8 = "G12_Deprecated";
  }
  else if (format == B12_Deprecated) {
    local_8 = "B12_Deprecated";
  }
  else if (format == Coord3D_A12p) {
    local_8 = "Coord3D_A12p";
  }
  else if (format == Coord3D_B12p) {
    local_8 = "Coord3D_B12p";
  }
  else if (format == Coord3D_C12p) {
    local_8 = "Coord3D_C12p";
  }
  else if (format == Mono14p) {
    local_8 = "Mono14p";
  }
  else if (format == BayerGR14p) {
    local_8 = "BayerGR14p";
  }
  else if (format == BayerRG14p) {
    local_8 = "BayerRG14p";
  }
  else if (format == BayerGB14p) {
    local_8 = "BayerGB14p";
  }
  else if (format == BayerBG14p) {
    local_8 = "BayerBG14p";
  }
  else if (format == Mono10) {
    local_8 = "Mono10";
  }
  else if (format == Mono12) {
    local_8 = "Mono12";
  }
  else if (format == Mono16) {
    local_8 = "Mono16";
  }
  else if (format == BayerGR10) {
    local_8 = "BayerGR10";
  }
  else if (format == BayerRG10) {
    local_8 = "BayerRG10";
  }
  else if (format == BayerGB10) {
    local_8 = "BayerGB10";
  }
  else if (format == BayerBG10) {
    local_8 = "BayerBG10";
  }
  else if (format == BayerGR12) {
    local_8 = "BayerGR12";
  }
  else if (format == BayerRG12) {
    local_8 = "BayerRG12";
  }
  else if (format == BayerGB12) {
    local_8 = "BayerGB12";
  }
  else if (format == BayerBG12) {
    local_8 = "BayerBG12";
  }
  else if (format == Mono14) {
    local_8 = "Mono14";
  }
  else if (format == BayerGR16) {
    local_8 = "BayerGR16";
  }
  else if (format == BayerRG16) {
    local_8 = "BayerRG16";
  }
  else if (format == BayerGB16) {
    local_8 = "BayerGB16";
  }
  else if (format == BayerBG16) {
    local_8 = "BayerBG16";
  }
  else if (format == SCF1WBWG10) {
    local_8 = "SCF1WBWG10";
  }
  else if (format == SCF1WBWG12) {
    local_8 = "SCF1WBWG12";
  }
  else if (format == SCF1WBWG14) {
    local_8 = "SCF1WBWG14";
  }
  else if (format == SCF1WBWG16) {
    local_8 = "SCF1WBWG16";
  }
  else if (format == SCF1WGWB10) {
    local_8 = "SCF1WGWB10";
  }
  else if (format == SCF1WGWB12) {
    local_8 = "SCF1WGWB12";
  }
  else if (format == SCF1WGWB14) {
    local_8 = "SCF1WGWB14";
  }
  else if (format == SCF1WGWB16) {
    local_8 = "SCF1WGWB16";
  }
  else if (format == SCF1WGWR10) {
    local_8 = "SCF1WGWR10";
  }
  else if (format == SCF1WGWR12) {
    local_8 = "SCF1WGWR12";
  }
  else if (format == SCF1WGWR14) {
    local_8 = "SCF1WGWR14";
  }
  else if (format == SCF1WGWR16) {
    local_8 = "SCF1WGWR16";
  }
  else if (format == SCF1WRWG10) {
    local_8 = "SCF1WRWG10";
  }
  else if (format == SCF1WRWG12) {
    local_8 = "SCF1WRWG12";
  }
  else if (format == SCF1WRWG14) {
    local_8 = "SCF1WRWG14";
  }
  else if (format == SCF1WRWG16) {
    local_8 = "SCF1WRWG16";
  }
  else if (format == Coord3D_A16) {
    local_8 = "Coord3D_A16";
  }
  else if (format == Coord3D_B16) {
    local_8 = "Coord3D_B16";
  }
  else if (format == Coord3D_C16) {
    local_8 = "Coord3D_C16";
  }
  else if (format == Confidence16) {
    local_8 = "Confidence16";
  }
  else if (format == R16) {
    local_8 = "R16";
  }
  else if (format == G16) {
    local_8 = "G16";
  }
  else if (format == B16) {
    local_8 = "B16";
  }
  else if (format == BayerGR14) {
    local_8 = "BayerGR14";
  }
  else if (format == BayerRG14) {
    local_8 = "BayerRG14";
  }
  else if (format == BayerGB14) {
    local_8 = "BayerGB14";
  }
  else if (format == BayerBG14) {
    local_8 = "BayerBG14";
  }
  else if (format == Data16) {
    local_8 = "Data16";
  }
  else if (format == Data16s) {
    local_8 = "Data16s";
  }
  else if (format == R10) {
    local_8 = "R10";
  }
  else if (format == R12) {
    local_8 = "R12";
  }
  else if (format == G10) {
    local_8 = "G10";
  }
  else if (format == G12) {
    local_8 = "G12";
  }
  else if (format == B10) {
    local_8 = "B10";
  }
  else if (format == B12) {
    local_8 = "B12";
  }
  else if (format == Coord3D_A32f) {
    local_8 = "Coord3D_A32f";
  }
  else if (format == Coord3D_B32f) {
    local_8 = "Coord3D_B32f";
  }
  else if (format == Coord3D_C32f) {
    local_8 = "Coord3D_C32f";
  }
  else if (format == Confidence32f) {
    local_8 = "Confidence32f";
  }
  else if (format == Mono32) {
    local_8 = "Mono32";
  }
  else if (format == Data32) {
    local_8 = "Data32";
  }
  else if (format == Data32s) {
    local_8 = "Data32s";
  }
  else if (format == Data32f) {
    local_8 = "Data32f";
  }
  else if (format == Data64) {
    local_8 = "Data64";
  }
  else if (format == Data64s) {
    local_8 = "Data64s";
  }
  else if (format == Data64f) {
    local_8 = "Data64f";
  }
  else if (format == YUV411_8_UYYVYY) {
    local_8 = "YUV411_8_UYYVYY";
  }
  else if (format == YCbCr411_8_CbYYCrYY) {
    local_8 = "YCbCr411_8_CbYYCrYY";
  }
  else if (format == YCbCr601_411_8_CbYYCrYY) {
    local_8 = "YCbCr601_411_8_CbYYCrYY";
  }
  else if (format == YCbCr709_411_8_CbYYCrYY) {
    local_8 = "YCbCr709_411_8_CbYYCrYY";
  }
  else if (format == YCbCr411_8) {
    local_8 = "YCbCr411_8";
  }
  else if (format == YCbCr2020_411_8_CbYYCrYY) {
    local_8 = "YCbCr2020_411_8_CbYYCrYY";
  }
  else if (format == YCbCr420_8_YY_CbCr_Semiplanar) {
    local_8 = "YCbCr420_8_YY_CbCr_Semiplanar";
  }
  else if (format == YCbCr420_8_YY_CrCb_Semiplanar) {
    local_8 = "YCbCr420_8_YY_CrCb_Semiplanar";
  }
  else if (format == YUV422_8_UYVY) {
    local_8 = "YUV422_8_UYVY";
  }
  else if (format == YUV422_8) {
    local_8 = "YUV422_8";
  }
  else if (format == RGB565p) {
    local_8 = "RGB565p";
  }
  else if (format == BGR565p) {
    local_8 = "BGR565p";
  }
  else if (format == YCbCr422_8) {
    local_8 = "YCbCr422_8";
  }
  else if (format == YCbCr601_422_8) {
    local_8 = "YCbCr601_422_8";
  }
  else if (format == YCbCr709_422_8) {
    local_8 = "YCbCr709_422_8";
  }
  else if (format == YCbCr422_8_CbYCrY) {
    local_8 = "YCbCr422_8_CbYCrY";
  }
  else if (format == YCbCr601_422_8_CbYCrY) {
    local_8 = "YCbCr601_422_8_CbYCrY";
  }
  else if (format == YCbCr709_422_8_CbYCrY) {
    local_8 = "YCbCr709_422_8_CbYCrY";
  }
  else if (format == BiColorRGBG8) {
    local_8 = "BiColorRGBG8";
  }
  else if (format == BiColorBGRG8) {
    local_8 = "BiColorBGRG8";
  }
  else if (format == Coord3D_AC8) {
    local_8 = "Coord3D_AC8";
  }
  else if (format == Coord3D_AC8_Planar) {
    local_8 = "Coord3D_AC8_Planar";
  }
  else if (format == YCbCr2020_422_8) {
    local_8 = "YCbCr2020_422_8";
  }
  else if (format == YCbCr2020_422_8_CbYCrY) {
    local_8 = "YCbCr2020_422_8_CbYCrY";
  }
  else if (format == YCbCr422_8_YY_CbCr_Semiplanar) {
    local_8 = "YCbCr422_8_YY_CbCr_Semiplanar";
  }
  else if (format == YCbCr422_8_YY_CrCb_Semiplanar) {
    local_8 = "YCbCr422_8_YY_CrCb_Semiplanar";
  }
  else if (format == YCbCr422_10p) {
    local_8 = "YCbCr422_10p";
  }
  else if (format == YCbCr601_422_10p) {
    local_8 = "YCbCr601_422_10p";
  }
  else if (format == YCbCr709_422_10p) {
    local_8 = "YCbCr709_422_10p";
  }
  else if (format == YCbCr422_10p_CbYCrY) {
    local_8 = "YCbCr422_10p_CbYCrY";
  }
  else if (format == YCbCr601_422_10p_CbYCrY) {
    local_8 = "YCbCr601_422_10p_CbYCrY";
  }
  else if (format == YCbCr709_422_10p_CbYCrY) {
    local_8 = "YCbCr709_422_10p_CbYCrY";
  }
  else if (format == BiColorRGBG10p) {
    local_8 = "BiColorRGBG10p";
  }
  else if (format == BiColorBGRG10p) {
    local_8 = "BiColorBGRG10p";
  }
  else if (format == Coord3D_AC10p) {
    local_8 = "Coord3D_AC10p";
  }
  else if (format == Coord3D_AC10p_Planar) {
    local_8 = "Coord3D_AC10p_Planar";
  }
  else if (format == YCbCr2020_422_10p) {
    local_8 = "YCbCr2020_422_10p";
  }
  else if (format == YCbCr2020_422_10p_CbYCrY) {
    local_8 = "YCbCr2020_422_10p_CbYCrY";
  }
  else if (format == RGB8) {
    local_8 = "RGB8";
  }
  else if (format == BGR8) {
    local_8 = "BGR8";
  }
  else if (format == YUV8_UYV) {
    local_8 = "YUV8_UYV";
  }
  else if (format == RGB8_Planar) {
    local_8 = "RGB8_Planar";
  }
  else if (format == YCbCr8_CbYCr) {
    local_8 = "YCbCr8_CbYCr";
  }
  else if (format == YCbCr601_8_CbYCr) {
    local_8 = "YCbCr601_8_CbYCr";
  }
  else if (format == YCbCr709_8_CbYCr) {
    local_8 = "YCbCr709_8_CbYCr";
  }
  else if (format == YCbCr8) {
    local_8 = "YCbCr8";
  }
  else if (format == YCbCr422_12p) {
    local_8 = "YCbCr422_12p";
  }
  else if (format == YCbCr601_422_12p) {
    local_8 = "YCbCr601_422_12p";
  }
  else if (format == YCbCr709_422_12p) {
    local_8 = "YCbCr709_422_12p";
  }
  else if (format == YCbCr422_12p_CbYCrY) {
    local_8 = "YCbCr422_12p_CbYCrY";
  }
  else if (format == YCbCr601_422_12p_CbYCrY) {
    local_8 = "YCbCr601_422_12p_CbYCrY";
  }
  else if (format == YCbCr709_422_12p_CbYCrY) {
    local_8 = "YCbCr709_422_12p_CbYCrY";
  }
  else if (format == BiColorRGBG12p) {
    local_8 = "BiColorRGBG12p";
  }
  else if (format == BiColorBGRG12p) {
    local_8 = "BiColorBGRG12p";
  }
  else if (format == Coord3D_ABC8) {
    local_8 = "Coord3D_ABC8";
  }
  else if (format == Coord3D_ABC8_Planar) {
    local_8 = "Coord3D_ABC8_Planar";
  }
  else if (format == Coord3D_AC12p) {
    local_8 = "Coord3D_AC12p";
  }
  else if (format == Coord3D_AC12p_Planar) {
    local_8 = "Coord3D_AC12p_Planar";
  }
  else if (format == YCbCr2020_8_CbYCr) {
    local_8 = "YCbCr2020_8_CbYCr";
  }
  else if (format == YCbCr2020_422_12p) {
    local_8 = "YCbCr2020_422_12p";
  }
  else if (format == YCbCr2020_422_12p_CbYCrY) {
    local_8 = "YCbCr2020_422_12p_CbYCrY";
  }
  else if (format == BGR10p) {
    local_8 = "BGR10p";
  }
  else if (format == RGB10p) {
    local_8 = "RGB10p";
  }
  else if (format == YCbCr10p_CbYCr) {
    local_8 = "YCbCr10p_CbYCr";
  }
  else if (format == YCbCr601_10p_CbYCr) {
    local_8 = "YCbCr601_10p_CbYCr";
  }
  else if (format == YCbCr709_10p_CbYCr) {
    local_8 = "YCbCr709_10p_CbYCr";
  }
  else if (format == Coord3D_ABC10p) {
    local_8 = "Coord3D_ABC10p";
  }
  else if (format == Coord3D_ABC10p_Planar) {
    local_8 = "Coord3D_ABC10p_Planar";
  }
  else if (format == YCbCr2020_10p_CbYCr) {
    local_8 = "YCbCr2020_10p_CbYCr";
  }
  else if (format == RGBa8) {
    local_8 = "RGBa8";
  }
  else if (format == BGRa8) {
    local_8 = "BGRa8";
  }
  else if (format == RGB10V1Packed) {
    local_8 = "RGB10V1Packed";
  }
  else if (format == RGB10p32) {
    local_8 = "RGB10p32";
  }
  else if (format == YCbCr422_10) {
    local_8 = "YCbCr422_10";
  }
  else if (format == YCbCr422_12) {
    local_8 = "YCbCr422_12";
  }
  else if (format == YCbCr601_422_10) {
    local_8 = "YCbCr601_422_10";
  }
  else if (format == YCbCr601_422_12) {
    local_8 = "YCbCr601_422_12";
  }
  else if (format == YCbCr709_422_10) {
    local_8 = "YCbCr709_422_10";
  }
  else if (format == YCbCr709_422_12) {
    local_8 = "YCbCr709_422_12";
  }
  else if (format == YCbCr422_10_CbYCrY) {
    local_8 = "YCbCr422_10_CbYCrY";
  }
  else if (format == YCbCr422_12_CbYCrY) {
    local_8 = "YCbCr422_12_CbYCrY";
  }
  else if (format == YCbCr601_422_10_CbYCrY) {
    local_8 = "YCbCr601_422_10_CbYCrY";
  }
  else if (format == YCbCr601_422_12_CbYCrY) {
    local_8 = "YCbCr601_422_12_CbYCrY";
  }
  else if (format == YCbCr709_422_10_CbYCrY) {
    local_8 = "YCbCr709_422_10_CbYCrY";
  }
  else if (format == YCbCr709_422_12_CbYCrY) {
    local_8 = "YCbCr709_422_12_CbYCrY";
  }
  else if (format == BiColorRGBG10) {
    local_8 = "BiColorRGBG10";
  }
  else if (format == BiColorBGRG10) {
    local_8 = "BiColorBGRG10";
  }
  else if (format == BiColorRGBG12) {
    local_8 = "BiColorRGBG12";
  }
  else if (format == BiColorBGRG12) {
    local_8 = "BiColorBGRG12";
  }
  else if (format == Coord3D_AC16) {
    local_8 = "Coord3D_AC16";
  }
  else if (format == Coord3D_AC16_Planar) {
    local_8 = "Coord3D_AC16_Planar";
  }
  else if (format == YCbCr2020_422_10) {
    local_8 = "YCbCr2020_422_10";
  }
  else if (format == YCbCr2020_422_10_CbYCrY) {
    local_8 = "YCbCr2020_422_10_CbYCrY";
  }
  else if (format == YCbCr2020_422_12) {
    local_8 = "YCbCr2020_422_12";
  }
  else if (format == YCbCr2020_422_12_CbYCrY) {
    local_8 = "YCbCr2020_422_12_CbYCrY";
  }
  else if (format == RGB12V1Packed) {
    local_8 = "RGB12V1Packed";
  }
  else if (format == BGR12p) {
    local_8 = "BGR12p";
  }
  else if (format == RGB12p) {
    local_8 = "RGB12p";
  }
  else if (format == YCbCr12p_CbYCr) {
    local_8 = "YCbCr12p_CbYCr";
  }
  else if (format == YCbCr601_12p_CbYCr) {
    local_8 = "YCbCr601_12p_CbYCr";
  }
  else if (format == YCbCr709_12p_CbYCr) {
    local_8 = "YCbCr709_12p_CbYCr";
  }
  else if (format == Coord3D_ABC12p) {
    local_8 = "Coord3D_ABC12p";
  }
  else if (format == Coord3D_ABC12p_Planar) {
    local_8 = "Coord3D_ABC12p_Planar";
  }
  else if (format == YCbCr2020_12p_CbYCr) {
    local_8 = "YCbCr2020_12p_CbYCr";
  }
  else if (format == BGRa10p) {
    local_8 = "BGRa10p";
  }
  else if (format == RGBa10p) {
    local_8 = "RGBa10p";
  }
  else if (format == RGB10) {
    local_8 = "RGB10";
  }
  else if (format == BGR10) {
    local_8 = "BGR10";
  }
  else if (format == RGB12) {
    local_8 = "RGB12";
  }
  else if (format == BGR12) {
    local_8 = "BGR12";
  }
  else if (format == RGB10_Planar) {
    local_8 = "RGB10_Planar";
  }
  else if (format == RGB12_Planar) {
    local_8 = "RGB12_Planar";
  }
  else if (format == RGB16_Planar) {
    local_8 = "RGB16_Planar";
  }
  else if (format == RGB16) {
    local_8 = "RGB16";
  }
  else if (format == BGR14) {
    local_8 = "BGR14";
  }
  else if (format == BGR16) {
    local_8 = "BGR16";
  }
  else if (format == BGRa12p) {
    local_8 = "BGRa12p";
  }
  else if (format == RGB14) {
    local_8 = "RGB14";
  }
  else if (format == RGBa12p) {
    local_8 = "RGBa12p";
  }
  else if (format == YCbCr10_CbYCr) {
    local_8 = "YCbCr10_CbYCr";
  }
  else if (format == YCbCr12_CbYCr) {
    local_8 = "YCbCr12_CbYCr";
  }
  else if (format == YCbCr601_10_CbYCr) {
    local_8 = "YCbCr601_10_CbYCr";
  }
  else if (format == YCbCr601_12_CbYCr) {
    local_8 = "YCbCr601_12_CbYCr";
  }
  else if (format == YCbCr709_10_CbYCr) {
    local_8 = "YCbCr709_10_CbYCr";
  }
  else if (format == YCbCr709_12_CbYCr) {
    local_8 = "YCbCr709_12_CbYCr";
  }
  else if (format == Coord3D_ABC16) {
    local_8 = "Coord3D_ABC16";
  }
  else if (format == Coord3D_ABC16_Planar) {
    local_8 = "Coord3D_ABC16_Planar";
  }
  else if (format == YCbCr2020_10_CbYCr) {
    local_8 = "YCbCr2020_10_CbYCr";
  }
  else if (format == YCbCr2020_12_CbYCr) {
    local_8 = "YCbCr2020_12_CbYCr";
  }
  else if (format == BGRa10) {
    local_8 = "BGRa10";
  }
  else if (format == BGRa12) {
    local_8 = "BGRa12";
  }
  else if (format == BGRa14) {
    local_8 = "BGRa14";
  }
  else if (format == BGRa16) {
    local_8 = "BGRa16";
  }
  else if (format == RGBa10) {
    local_8 = "RGBa10";
  }
  else if (format == RGBa12) {
    local_8 = "RGBa12";
  }
  else if (format == RGBa14) {
    local_8 = "RGBa14";
  }
  else if (format == RGBa16) {
    local_8 = "RGBa16";
  }
  else if (format == Coord3D_AC32f) {
    local_8 = "Coord3D_AC32f";
  }
  else if (format == Coord3D_AC32f_Planar) {
    local_8 = "Coord3D_AC32f_Planar";
  }
  else if (format == Coord3D_ABC32f) {
    local_8 = "Coord3D_ABC32f";
  }
  else if (format == Coord3D_ABC32f_Planar) {
    local_8 = "Coord3D_ABC32f_Planar";
  }
  else {
    local_8 = "UnknownPixelFormat";
  }
  return local_8;
}

Assistant:

static PFNC_INLINE const char* GetPixelFormatName (PfncFormat format)
{
  switch (format)
  {
    case Mono1p:                                  return "Mono1p";
    case Mono2p:                                  return "Mono2p";
    case Mono4p:                                  return "Mono4p";
    case Mono8:                                   return "Mono8";
    case Mono8s:                                  return "Mono8s";
    case Mono10:                                  return "Mono10";
    case Mono10p:                                 return "Mono10p";
    case Mono12:                                  return "Mono12";
    case Mono12p:                                 return "Mono12p";
    case Mono14:                                  return "Mono14";
    case Mono14p:                                 return "Mono14p";
    case Mono16:                                  return "Mono16";
    case Mono32:                                  return "Mono32";
    case BayerBG4p:                               return "BayerBG4p";
    case BayerBG8:                                return "BayerBG8";
    case BayerBG10:                               return "BayerBG10";
    case BayerBG10p:                              return "BayerBG10p";
    case BayerBG12:                               return "BayerBG12";
    case BayerBG12p:                              return "BayerBG12p";
    case BayerBG14:                               return "BayerBG14";
    case BayerBG14p:                              return "BayerBG14p";
    case BayerBG16:                               return "BayerBG16";
    case BayerGB4p:                               return "BayerGB4p";
    case BayerGB8:                                return "BayerGB8";
    case BayerGB10:                               return "BayerGB10";
    case BayerGB10p:                              return "BayerGB10p";
    case BayerGB12:                               return "BayerGB12";
    case BayerGB12p:                              return "BayerGB12p";
    case BayerGB14:                               return "BayerGB14";
    case BayerGB14p:                              return "BayerGB14p";
    case BayerGB16:                               return "BayerGB16";
    case BayerGR4p:                               return "BayerGR4p";
    case BayerGR8:                                return "BayerGR8";
    case BayerGR10:                               return "BayerGR10";
    case BayerGR10p:                              return "BayerGR10p";
    case BayerGR12:                               return "BayerGR12";
    case BayerGR12p:                              return "BayerGR12p";
    case BayerGR14:                               return "BayerGR14";
    case BayerGR14p:                              return "BayerGR14p";
    case BayerGR16:                               return "BayerGR16";
    case BayerRG4p:                               return "BayerRG4p";
    case BayerRG8:                                return "BayerRG8";
    case BayerRG10:                               return "BayerRG10";
    case BayerRG10p:                              return "BayerRG10p";
    case BayerRG12:                               return "BayerRG12";
    case BayerRG12p:                              return "BayerRG12p";
    case BayerRG14:                               return "BayerRG14";
    case BayerRG14p:                              return "BayerRG14p";
    case BayerRG16:                               return "BayerRG16";
    case RGBa8:                                   return "RGBa8";
    case RGBa10:                                  return "RGBa10";
    case RGBa10p:                                 return "RGBa10p";
    case RGBa12:                                  return "RGBa12";
    case RGBa12p:                                 return "RGBa12p";
    case RGBa14:                                  return "RGBa14";
    case RGBa16:                                  return "RGBa16";
    case RGB8:                                    return "RGB8";
    case RGB8_Planar:                             return "RGB8_Planar";
    case RGB10:                                   return "RGB10";
    case RGB10_Planar:                            return "RGB10_Planar";
    case RGB10p:                                  return "RGB10p";
    case RGB10p32:                                return "RGB10p32";
    case RGB12:                                   return "RGB12";
    case RGB12_Planar:                            return "RGB12_Planar";
    case RGB12p:                                  return "RGB12p";
    case RGB14:                                   return "RGB14";
    case RGB16:                                   return "RGB16";
    case RGB16_Planar:                            return "RGB16_Planar";
    case RGB565p:                                 return "RGB565p";
    case BGRa8:                                   return "BGRa8";
    case BGRa10:                                  return "BGRa10";
    case BGRa10p:                                 return "BGRa10p";
    case BGRa12:                                  return "BGRa12";
    case BGRa12p:                                 return "BGRa12p";
    case BGRa14:                                  return "BGRa14";
    case BGRa16:                                  return "BGRa16";
    case BGR8:                                    return "BGR8";
    case BGR10:                                   return "BGR10";
    case BGR10p:                                  return "BGR10p";
    case BGR12:                                   return "BGR12";
    case BGR12p:                                  return "BGR12p";
    case BGR14:                                   return "BGR14";
    case BGR16:                                   return "BGR16";
    case BGR565p:                                 return "BGR565p";
    case R8:                                      return "R8";
    case R10:                                     return "R10";
    case R10_Deprecated:                          return "R10_Deprecated";
    case R12:                                     return "R12";
    case R12_Deprecated:                          return "R12_Deprecated";
    case R16:                                     return "R16";
    case G8:                                      return "G8";
    case G10:                                     return "G10";
    case G10_Deprecated:                          return "G10_Deprecated";
    case G12:                                     return "G12";
    case G12_Deprecated:                          return "G12_Deprecated";
    case G16:                                     return "G16";
    case B8:                                      return "B8";
    case B10:                                     return "B10";
    case B10_Deprecated:                          return "B10_Deprecated";
    case B12:                                     return "B12";
    case B12_Deprecated:                          return "B12_Deprecated";
    case B16:                                     return "B16";
    case Coord3D_ABC8:                            return "Coord3D_ABC8";
    case Coord3D_ABC8_Planar:                     return "Coord3D_ABC8_Planar";
    case Coord3D_ABC10p:                          return "Coord3D_ABC10p";
    case Coord3D_ABC10p_Planar:                   return "Coord3D_ABC10p_Planar";
    case Coord3D_ABC12p:                          return "Coord3D_ABC12p";
    case Coord3D_ABC12p_Planar:                   return "Coord3D_ABC12p_Planar";
    case Coord3D_ABC16:                           return "Coord3D_ABC16";
    case Coord3D_ABC16_Planar:                    return "Coord3D_ABC16_Planar";
    case Coord3D_ABC32f:                          return "Coord3D_ABC32f";
    case Coord3D_ABC32f_Planar:                   return "Coord3D_ABC32f_Planar";
    case Coord3D_AC8:                             return "Coord3D_AC8";
    case Coord3D_AC8_Planar:                      return "Coord3D_AC8_Planar";
    case Coord3D_AC10p:                           return "Coord3D_AC10p";
    case Coord3D_AC10p_Planar:                    return "Coord3D_AC10p_Planar";
    case Coord3D_AC12p:                           return "Coord3D_AC12p";
    case Coord3D_AC12p_Planar:                    return "Coord3D_AC12p_Planar";
    case Coord3D_AC16:                            return "Coord3D_AC16";
    case Coord3D_AC16_Planar:                     return "Coord3D_AC16_Planar";
    case Coord3D_AC32f:                           return "Coord3D_AC32f";
    case Coord3D_AC32f_Planar:                    return "Coord3D_AC32f_Planar";
    case Coord3D_A8:                              return "Coord3D_A8";
    case Coord3D_A10p:                            return "Coord3D_A10p";
    case Coord3D_A12p:                            return "Coord3D_A12p";
    case Coord3D_A16:                             return "Coord3D_A16";
    case Coord3D_A32f:                            return "Coord3D_A32f";
    case Coord3D_B8:                              return "Coord3D_B8";
    case Coord3D_B10p:                            return "Coord3D_B10p";
    case Coord3D_B12p:                            return "Coord3D_B12p";
    case Coord3D_B16:                             return "Coord3D_B16";
    case Coord3D_B32f:                            return "Coord3D_B32f";
    case Coord3D_C8:                              return "Coord3D_C8";
    case Coord3D_C10p:                            return "Coord3D_C10p";
    case Coord3D_C12p:                            return "Coord3D_C12p";
    case Coord3D_C16:                             return "Coord3D_C16";
    case Coord3D_C32f:                            return "Coord3D_C32f";
    case Confidence1:                             return "Confidence1";
    case Confidence1p:                            return "Confidence1p";
    case Confidence8:                             return "Confidence8";
    case Confidence16:                            return "Confidence16";
    case Confidence32f:                           return "Confidence32f";
    case BiColorBGRG8:                            return "BiColorBGRG8";
    case BiColorBGRG10:                           return "BiColorBGRG10";
    case BiColorBGRG10p:                          return "BiColorBGRG10p";
    case BiColorBGRG12:                           return "BiColorBGRG12";
    case BiColorBGRG12p:                          return "BiColorBGRG12p";
    case BiColorRGBG8:                            return "BiColorRGBG8";
    case BiColorRGBG10:                           return "BiColorRGBG10";
    case BiColorRGBG10p:                          return "BiColorRGBG10p";
    case BiColorRGBG12:                           return "BiColorRGBG12";
    case BiColorRGBG12p:                          return "BiColorRGBG12p";
    case Data8:                                   return "Data8";
    case Data8s:                                  return "Data8s";
    case Data16:                                  return "Data16";
    case Data16s:                                 return "Data16s";
    case Data32:                                  return "Data32";
    case Data32f:                                 return "Data32f";
    case Data32s:                                 return "Data32s";
    case Data64:                                  return "Data64";
    case Data64f:                                 return "Data64f";
    case Data64s:                                 return "Data64s";
    case SCF1WBWG8:                               return "SCF1WBWG8";
    case SCF1WBWG10:                              return "SCF1WBWG10";
    case SCF1WBWG10p:                             return "SCF1WBWG10p";
    case SCF1WBWG12:                              return "SCF1WBWG12";
    case SCF1WBWG12p:                             return "SCF1WBWG12p";
    case SCF1WBWG14:                              return "SCF1WBWG14";
    case SCF1WBWG16:                              return "SCF1WBWG16";
    case SCF1WGWB8:                               return "SCF1WGWB8";
    case SCF1WGWB10:                              return "SCF1WGWB10";
    case SCF1WGWB10p:                             return "SCF1WGWB10p";
    case SCF1WGWB12:                              return "SCF1WGWB12";
    case SCF1WGWB12p:                             return "SCF1WGWB12p";
    case SCF1WGWB14:                              return "SCF1WGWB14";
    case SCF1WGWB16:                              return "SCF1WGWB16";
    case SCF1WGWR8:                               return "SCF1WGWR8";
    case SCF1WGWR10:                              return "SCF1WGWR10";
    case SCF1WGWR10p:                             return "SCF1WGWR10p";
    case SCF1WGWR12:                              return "SCF1WGWR12";
    case SCF1WGWR12p:                             return "SCF1WGWR12p";
    case SCF1WGWR14:                              return "SCF1WGWR14";
    case SCF1WGWR16:                              return "SCF1WGWR16";
    case SCF1WRWG8:                               return "SCF1WRWG8";
    case SCF1WRWG10:                              return "SCF1WRWG10";
    case SCF1WRWG10p:                             return "SCF1WRWG10p";
    case SCF1WRWG12:                              return "SCF1WRWG12";
    case SCF1WRWG12p:                             return "SCF1WRWG12p";
    case SCF1WRWG14:                              return "SCF1WRWG14";
    case SCF1WRWG16:                              return "SCF1WRWG16";
    case YCbCr8:                                  return "YCbCr8";
    case YCbCr8_CbYCr:                            return "YCbCr8_CbYCr";
    case YCbCr10_CbYCr:                           return "YCbCr10_CbYCr";
    case YCbCr10p_CbYCr:                          return "YCbCr10p_CbYCr";
    case YCbCr12_CbYCr:                           return "YCbCr12_CbYCr";
    case YCbCr12p_CbYCr:                          return "YCbCr12p_CbYCr";
    case YCbCr411_8:                              return "YCbCr411_8";
    case YCbCr411_8_CbYYCrYY:                     return "YCbCr411_8_CbYYCrYY";
    case YCbCr420_8_YY_CbCr_Semiplanar:           return "YCbCr420_8_YY_CbCr_Semiplanar";
    case YCbCr420_8_YY_CrCb_Semiplanar:           return "YCbCr420_8_YY_CrCb_Semiplanar";
    case YCbCr422_8:                              return "YCbCr422_8";
    case YCbCr422_8_CbYCrY:                       return "YCbCr422_8_CbYCrY";
    case YCbCr422_8_YY_CbCr_Semiplanar:           return "YCbCr422_8_YY_CbCr_Semiplanar";
    case YCbCr422_8_YY_CrCb_Semiplanar:           return "YCbCr422_8_YY_CrCb_Semiplanar";
    case YCbCr422_10:                             return "YCbCr422_10";
    case YCbCr422_10_CbYCrY:                      return "YCbCr422_10_CbYCrY";
    case YCbCr422_10p:                            return "YCbCr422_10p";
    case YCbCr422_10p_CbYCrY:                     return "YCbCr422_10p_CbYCrY";
    case YCbCr422_12:                             return "YCbCr422_12";
    case YCbCr422_12_CbYCrY:                      return "YCbCr422_12_CbYCrY";
    case YCbCr422_12p:                            return "YCbCr422_12p";
    case YCbCr422_12p_CbYCrY:                     return "YCbCr422_12p_CbYCrY";
    case YCbCr601_8_CbYCr:                        return "YCbCr601_8_CbYCr";
    case YCbCr601_10_CbYCr:                       return "YCbCr601_10_CbYCr";
    case YCbCr601_10p_CbYCr:                      return "YCbCr601_10p_CbYCr";
    case YCbCr601_12_CbYCr:                       return "YCbCr601_12_CbYCr";
    case YCbCr601_12p_CbYCr:                      return "YCbCr601_12p_CbYCr";
    case YCbCr601_411_8_CbYYCrYY:                 return "YCbCr601_411_8_CbYYCrYY";
    case YCbCr601_422_8:                          return "YCbCr601_422_8";
    case YCbCr601_422_8_CbYCrY:                   return "YCbCr601_422_8_CbYCrY";
    case YCbCr601_422_10:                         return "YCbCr601_422_10";
    case YCbCr601_422_10_CbYCrY:                  return "YCbCr601_422_10_CbYCrY";
    case YCbCr601_422_10p:                        return "YCbCr601_422_10p";
    case YCbCr601_422_10p_CbYCrY:                 return "YCbCr601_422_10p_CbYCrY";
    case YCbCr601_422_12:                         return "YCbCr601_422_12";
    case YCbCr601_422_12_CbYCrY:                  return "YCbCr601_422_12_CbYCrY";
    case YCbCr601_422_12p:                        return "YCbCr601_422_12p";
    case YCbCr601_422_12p_CbYCrY:                 return "YCbCr601_422_12p_CbYCrY";
    case YCbCr709_8_CbYCr:                        return "YCbCr709_8_CbYCr";
    case YCbCr709_10_CbYCr:                       return "YCbCr709_10_CbYCr";
    case YCbCr709_10p_CbYCr:                      return "YCbCr709_10p_CbYCr";
    case YCbCr709_12_CbYCr:                       return "YCbCr709_12_CbYCr";
    case YCbCr709_12p_CbYCr:                      return "YCbCr709_12p_CbYCr";
    case YCbCr709_411_8_CbYYCrYY:                 return "YCbCr709_411_8_CbYYCrYY";
    case YCbCr709_422_8:                          return "YCbCr709_422_8";
    case YCbCr709_422_8_CbYCrY:                   return "YCbCr709_422_8_CbYCrY";
    case YCbCr709_422_10:                         return "YCbCr709_422_10";
    case YCbCr709_422_10_CbYCrY:                  return "YCbCr709_422_10_CbYCrY";
    case YCbCr709_422_10p:                        return "YCbCr709_422_10p";
    case YCbCr709_422_10p_CbYCrY:                 return "YCbCr709_422_10p_CbYCrY";
    case YCbCr709_422_12:                         return "YCbCr709_422_12";
    case YCbCr709_422_12_CbYCrY:                  return "YCbCr709_422_12_CbYCrY";
    case YCbCr709_422_12p:                        return "YCbCr709_422_12p";
    case YCbCr709_422_12p_CbYCrY:                 return "YCbCr709_422_12p_CbYCrY";
    case YCbCr2020_8_CbYCr:                       return "YCbCr2020_8_CbYCr";
    case YCbCr2020_10_CbYCr:                      return "YCbCr2020_10_CbYCr";
    case YCbCr2020_10p_CbYCr:                     return "YCbCr2020_10p_CbYCr";
    case YCbCr2020_12_CbYCr:                      return "YCbCr2020_12_CbYCr";
    case YCbCr2020_12p_CbYCr:                     return "YCbCr2020_12p_CbYCr";
    case YCbCr2020_411_8_CbYYCrYY:                return "YCbCr2020_411_8_CbYYCrYY";
    case YCbCr2020_422_8:                         return "YCbCr2020_422_8";
    case YCbCr2020_422_8_CbYCrY:                  return "YCbCr2020_422_8_CbYCrY";
    case YCbCr2020_422_10:                        return "YCbCr2020_422_10";
    case YCbCr2020_422_10_CbYCrY:                 return "YCbCr2020_422_10_CbYCrY";
    case YCbCr2020_422_10p:                       return "YCbCr2020_422_10p";
    case YCbCr2020_422_10p_CbYCrY:                return "YCbCr2020_422_10p_CbYCrY";
    case YCbCr2020_422_12:                        return "YCbCr2020_422_12";
    case YCbCr2020_422_12_CbYCrY:                 return "YCbCr2020_422_12_CbYCrY";
    case YCbCr2020_422_12p:                       return "YCbCr2020_422_12p";
    case YCbCr2020_422_12p_CbYCrY:                return "YCbCr2020_422_12p_CbYCrY";
    case YUV8_UYV:                                return "YUV8_UYV";
    case YUV411_8_UYYVYY:                         return "YUV411_8_UYYVYY";
    case YUV422_8:                                return "YUV422_8";
    case YUV422_8_UYVY:                           return "YUV422_8_UYVY";
    case Mono10Packed:                            return "Mono10Packed";
    case Mono12Packed:                            return "Mono12Packed";
    case BayerBG10Packed:                         return "BayerBG10Packed";
    case BayerBG12Packed:                         return "BayerBG12Packed";
    case BayerGB10Packed:                         return "BayerGB10Packed";
    case BayerGB12Packed:                         return "BayerGB12Packed";
    case BayerGR10Packed:                         return "BayerGR10Packed";
    case BayerGR12Packed:                         return "BayerGR12Packed";
    case BayerRG10Packed:                         return "BayerRG10Packed";
    case BayerRG12Packed:                         return "BayerRG12Packed";
    case RGB10V1Packed:                           return "RGB10V1Packed";
    case RGB12V1Packed:                           return "RGB12V1Packed";

    case InvalidPixelFormat: return "InvalidPixelFormat";

    default: return "UnknownPixelFormat";
  }
}